

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O2

void plutovg_color_init_hsla(plutovg_color_t *color,float h,float s,float l,float a)

{
  float fVar1;
  float r;
  float g;
  
  fVar1 = fmodf(h,360.0);
  fVar1 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(fVar1 + 360.0) & -(uint)(fVar1 < 0.0)
                 );
  r = hsl_component(fVar1,s,l,0.0);
  g = hsl_component(fVar1,s,l,8.0);
  fVar1 = hsl_component(fVar1,s,l,4.0);
  plutovg_color_init_rgba(color,r,g,fVar1,a);
  return;
}

Assistant:

void plutovg_color_init_hsla(plutovg_color_t* color, float h, float s, float l, float a)
{
    h = fmodf(h, 360.f);
    if(h < 0.f) { h += 360.f; }

    float r = hsl_component(h, s, l, 0);
    float g = hsl_component(h, s, l, 8);
    float b = hsl_component(h, s, l, 4);
    plutovg_color_init_rgba(color, r, g, b, a);
}